

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void train(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  element_type *this;
  bool bVar1;
  char cVar2;
  int64_t iVar3;
  invalid_argument *this_00;
  shared_ptr<fasttext::FastText> fasttext;
  string outputFileName;
  Autotune autotune;
  _Any_data local_3d8;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  Args a;
  ofstream ofs;
  
  ::fasttext::Args::Args(&a);
  ::fasttext::Args::parseArgs(&a,args);
  std::make_shared<fasttext::FastText>();
  outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
  outputFileName._M_string_length = 0;
  outputFileName.field_2._M_local_buf[0] = '\0';
  bVar1 = ::fasttext::Args::hasAutotune(&a);
  if (bVar1) {
    iVar3 = ::fasttext::Args::getAutotuneModelSize(&a);
    if (iVar3 != -1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                     &a.output,".ftz");
      goto LAB_00107dbe;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,&a.output
                 ,".bin");
LAB_00107dbe:
  std::__cxx11::string::operator=((string *)&outputFileName,(string *)&ofs);
  std::__cxx11::string::~string((string *)&ofs);
  std::ofstream::ofstream(&ofs,(string *)&outputFileName,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::ofstream::close();
    bVar1 = ::fasttext::Args::hasAutotune(&a);
    if (bVar1) {
      ::fasttext::Autotune::Autotune
                (&autotune,
                 fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      local_3c8 = 0;
      uStack_3c0 = 0;
      local_3d8._M_unused._M_object = (void *)0x0;
      local_3d8._8_8_ = 0;
      ::fasttext::Autotune::train(&autotune,&a,(AutotuneCallback *)&local_3d8);
      std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
      ::fasttext::Autotune::~Autotune(&autotune);
    }
    else {
      autotune.bestScore_ = 0.0;
      autotune.trials_ = 0;
      autotune.sizeConstraintFailed_ = 0;
      autotune.fastText_ = (FastText *)0x0;
      autotune.elapsed_ = 0.0;
      ::fasttext::FastText::train
                (fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &a,(TrainCallback *)&autotune);
      std::_Function_base::~_Function_base((_Function_base *)&autotune);
    }
    ::fasttext::FastText::saveModel
              (fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &outputFileName);
    this = fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                   &a.output,".vec");
    ::fasttext::FastText::saveVectors(this,(string *)&autotune);
    std::__cxx11::string::~string((string *)&autotune);
    if (a.saveOutput == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                     &a.output,".output");
      ::fasttext::FastText::saveOutput
                (fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (string *)&autotune);
      std::__cxx11::string::~string((string *)&autotune);
    }
    std::ofstream::~ofstream(&ofs);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fasttext.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::fasttext::Args::~Args(&a);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&autotune,
                 &outputFileName," cannot be opened for saving.");
  std::invalid_argument::invalid_argument(this_00,(string *)&autotune);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void train(const std::vector<std::string> args) {
  Args a = Args();
  a.parseArgs(args);
  std::shared_ptr<FastText> fasttext = std::make_shared<FastText>();
  std::string outputFileName;

  if (a.hasAutotune() &&
      a.getAutotuneModelSize() != Args::kUnlimitedModelSize) {
    outputFileName = a.output + ".ftz";
  } else {
    outputFileName = a.output + ".bin";
  }
  std::ofstream ofs(outputFileName);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        outputFileName + " cannot be opened for saving.");
  }
  ofs.close();
  if (a.hasAutotune()) {
    Autotune autotune(fasttext.get());
    autotune.train(a);
  } else {
    fasttext->train(a);
  }
  fasttext->saveModel(outputFileName);
  fasttext->saveVectors(a.output + ".vec");
  if (a.saveOutput) {
    fasttext->saveOutput(a.output + ".output");
  }
}